

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateMIPSAssembly.cpp
# Opt level: O0

function *
getValueOfVarIml(function *fn,string *varName,string *varName1,Identifier *var,varType type)

{
  Identifier *pIVar1;
  string *fn_00;
  char cVar2;
  bool bVar3;
  identifierCategory iVar4;
  tokenCategory tVar5;
  int iVar6;
  varType vVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  size_type sVar11;
  mapped_type *pmVar12;
  ostream *poVar13;
  mapped_type *pmVar14;
  size_type sVar15;
  reference pvVar16;
  char *pcVar17;
  undefined4 in_register_00000084;
  int in_R9D;
  key_type local_1d8c;
  string local_1d88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d68 [36];
  mapped_type local_1d44;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_1d40;
  int base_11;
  char *local_1d38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d30;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d28;
  string local_1d20 [8];
  string name0_6;
  stringstream local_1d00 [8];
  stringstream stream2_6;
  ostream local_1cf0 [376];
  __cxx11 local_1b78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b58 [36];
  int local_1b34;
  __cxx11 local_1b30 [4];
  int base_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b10 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1af0 [32];
  string local_1ad0 [8];
  string vn_4;
  string local_1ab0 [8];
  string choose;
  __cxx11 local_1a90 [32];
  string local_1a70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a50 [36];
  Reg local_1a2c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a28 [32];
  __cxx11 local_1a08 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19e8 [32];
  __cxx11 local_19c8 [32];
  string local_19a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1988 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1968 [32];
  string local_1948 [8];
  string vn_3;
  __cxx11 local_1928 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1908 [32];
  __cxx11 local_18e8 [32];
  string local_18c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18a8 [32];
  __cxx11 local_1888 [36];
  Reg local_1864;
  string local_1860 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1840 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1820 [32];
  varType local_1800;
  varType local_17fc;
  varType ty2;
  varType ty1;
  string realName2;
  string local_17d8 [8];
  string realName1;
  undefined1 local_17b8 [8];
  string index2;
  undefined1 local_1798 [8];
  string index1;
  key_type local_1774;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1750 [36];
  mapped_type local_172c;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_1728;
  int base_9;
  _Base_ptr local_1720;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1718;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1710;
  string local_1708 [8];
  string name0_5;
  stringstream local_16e8 [8];
  stringstream stream2_5;
  ostream local_16d8 [376];
  __cxx11 local_1560 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1540 [36];
  int local_151c;
  __cxx11 local_1518 [4];
  int base_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14f8 [32];
  __cxx11 local_14d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14b8 [32];
  __cxx11 local_1498 [32];
  string local_1478 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1458 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1438 [32];
  string local_1418 [8];
  string vn_2;
  __cxx11 local_13f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13d8 [32];
  __cxx11 local_13b8 [32];
  string local_1398 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1378 [32];
  __cxx11 local_1358 [36];
  Reg local_1334;
  string local_1330 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1310 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12f0 [32];
  string local_12d0 [8];
  string realName_2;
  undefined1 local_12b0 [8];
  string index_3;
  key_type local_128c;
  int d2_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1268 [36];
  int local_1244;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_1240;
  int base_7;
  char *local_1238;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1230;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1228;
  string local_1220 [8];
  string name0_4;
  stringstream local_1200 [8];
  stringstream stream2_4;
  ostream local_11f0 [376];
  __cxx11 local_1078 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1058 [36];
  int local_1034;
  __cxx11 local_1030 [4];
  int base_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1010 [32];
  string local_ff0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fd0 [32];
  string local_fb0 [8];
  string vn_1;
  __cxx11 local_f90 [32];
  string local_f70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f50 [36];
  Reg local_f2c;
  string local_f28 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f08 [32];
  string local_ee8 [8];
  string realName_1;
  undefined1 local_ec8 [8];
  string index_2;
  key_type local_ea4;
  int d1_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e80 [36];
  mapped_type local_e5c;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_e58;
  int base_5;
  char *local_e50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e40;
  string local_e38 [8];
  string name0_3;
  stringstream local_e18 [8];
  stringstream stream2_3;
  ostream local_e08 [376];
  __cxx11 local_c90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c70 [36];
  int local_c4c;
  __cxx11 local_c48 [4];
  int base_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c28 [32];
  int local_c08;
  int local_c04;
  int index_1;
  int d2;
  int d1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd8 [36];
  mapped_type local_bb4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_bb0;
  int base_3;
  char *local_ba8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ba0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b98;
  string local_b90 [8];
  string name0_2;
  stringstream local_b70 [8];
  stringstream stream2_2;
  ostream local_b60 [376];
  __cxx11 local_9e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c8 [36];
  int local_9a4;
  __cxx11 local_9a0 [4];
  int base_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_980 [32];
  string local_960 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_940 [32];
  string local_920 [8];
  string vn;
  __cxx11 local_900 [32];
  string local_8e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0 [36];
  Reg local_89c;
  string local_898 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878 [32];
  string local_858 [8];
  string realName;
  undefined1 local_838 [8];
  string index;
  key_type local_814;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f0 [36];
  mapped_type local_7cc;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_7c8;
  int base_1;
  char *local_7c0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7b8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7b0;
  string local_7a8 [8];
  string name0_1;
  stringstream local_788 [8];
  stringstream stream2_1;
  ostream local_778 [376];
  __cxx11 local_600 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0 [36];
  int local_5bc;
  __cxx11 local_5b8 [4];
  int base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598 [36];
  int local_574;
  string local_570 [4];
  int d1;
  undefined1 local_550 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  elements;
  __cxx11 local_530 [32];
  string local_510 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0 [32];
  Reg local_4d0;
  key_type local_4cc;
  string local_4c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8 [32];
  char *local_488;
  char *local_480;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_478;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_470;
  string local_468 [8];
  string name0;
  stringstream local_448 [8];
  stringstream stream2;
  ostream local_438 [376];
  __cxx11 local_2c0 [32];
  string local_2a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280 [32];
  int local_260;
  Reg local_25c;
  int offset;
  char *local_250;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_240;
  string local_238 [8];
  string name;
  string local_210 [32];
  string local_1f0 [48];
  stringstream local_1c0 [8];
  stringstream stream;
  ostream local_1b0 [380];
  int local_34;
  undefined8 uStack_30;
  varType type_local;
  Identifier *var_local;
  string *varName1_local;
  string *varName_local;
  function *fn_local;
  
  pIVar1 = (Identifier *)CONCAT44(in_register_00000084,type);
  uStack_30 = CONCAT44(in_register_00000084,type);
  local_34 = in_R9D;
  var_local = var;
  varName1_local = varName1;
  varName_local = varName;
  fn_local = fn;
  std::__cxx11::stringstream::stringstream(local_1c0);
  lVar10 = std::__cxx11::string::find((char)varName1_local,0x5b);
  if (lVar10 == -1) {
    if (((pIVar1->initialized & 1U) == 0) ||
       (iVar4 = Identifier::getIdCategory(pIVar1), iVar4 != CONST)) {
      std::__cxx11::string::string(local_238,(string *)var_local);
      local_240._M_current = (char *)std::__cxx11::string::begin();
      local_248._M_current = (char *)std::__cxx11::string::end();
      local_250 = (char *)std::__cxx11::string::begin();
      _offset = std::
                transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                          (local_240,local_248,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )local_250,tolower);
      bVar3 = function::varHasReg((function *)varName_local,(string *)var_local);
      if (bVar3) {
        local_25c = function::getRegOfVar((function *)varName_local,(string *)var_local,true);
        pmVar14 = std::
                  map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::at(&reg2str_abi_cxx11_,&local_25c);
        std::__cxx11::string::string((string *)fn,(string *)pmVar14);
      }
      else {
        bVar3 = function::stackHasVar((function *)varName_local,(string *)var_local);
        if ((bVar3) ||
           (sVar11 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::count(&var2mem_abi_cxx11_,(key_type *)local_238), fn_00 = varName_local,
           pIVar1 = var_local, sVar11 != 0)) {
          bVar3 = function::stackHasVar((function *)varName_local,(string *)var_local);
          if (bVar3) {
            local_260 = function::getOffSet((function *)varName_local,(string *)var_local);
            std::__cxx11::to_string(local_2c0,local_260);
            std::operator+((char *)local_2a0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "lw $t9 ");
            std::operator+(local_280,(char *)local_2a0);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,local_280);
            std::__cxx11::string::~string((string *)local_280);
            std::__cxx11::string::~string(local_2a0);
            std::__cxx11::string::~string((string *)local_2c0);
          }
          else {
            std::__cxx11::stringstream::stringstream(local_448);
            std::__cxx11::string::string(local_468,(string *)varName1_local);
            local_470._M_current = (char *)std::__cxx11::string::begin();
            local_478._M_current = (char *)std::__cxx11::string::end();
            local_480 = (char *)std::__cxx11::string::begin();
            local_488 = (char *)std::
                                transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                                          (local_470,local_478,
                                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            )local_480,tolower);
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::at(&var2mem_abi_cxx11_,(key_type *)local_468);
            local_260 = *pmVar12;
            poVar13 = std::operator<<(local_438,"0x");
            poVar13 = (ostream *)std::ostream::operator<<(poVar13,std::hex);
            std::ostream::operator<<(poVar13,local_260);
            std::__cxx11::stringstream::str();
            std::operator+((char *)local_4a8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "lw $t9 ");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,local_4a8);
            std::__cxx11::string::~string((string *)local_4a8);
            std::__cxx11::string::~string(local_4c8);
            std::__cxx11::string::~string(local_468);
            std::__cxx11::stringstream::~stringstream(local_448);
          }
          local_4cc = $t9;
          pmVar14 = std::
                    map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::at(&reg2str_abi_cxx11_,&local_4cc);
          std::__cxx11::string::string((string *)fn,(string *)pmVar14);
        }
        else {
          vVar7 = whatIsThisShit((string *)var_local,(function *)varName_local);
          variableArrangeSpace((function *)fn_00,(string *)pIVar1,vVar7);
          bVar3 = function::varHasReg((function *)varName_local,(string *)var_local);
          if (bVar3) {
            local_4d0 = function::getRegOfVar((function *)varName_local,(string *)var_local,false);
            pmVar14 = std::
                      map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::at(&reg2str_abi_cxx11_,&local_4d0);
            std::__cxx11::string::string((string *)fn,(string *)pmVar14);
          }
          else {
            iVar6 = function::getOffSet((function *)varName_local,(string *)var_local);
            std::__cxx11::to_string(local_530,iVar6);
            std::operator+((char *)local_510,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "lw $t9 ");
            std::operator+(local_4f0,(char *)local_510);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,local_4f0);
            std::__cxx11::string::~string((string *)local_4f0);
            std::__cxx11::string::~string(local_510);
            std::__cxx11::string::~string((string *)local_530);
            elements.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x19;
            pmVar14 = std::
                      map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::at(&reg2str_abi_cxx11_,
                           (key_type *)
                           ((long)&elements.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
            std::__cxx11::string::string((string *)fn,(string *)pmVar14);
          }
        }
      }
      std::__cxx11::string::~string(local_238);
    }
    else {
      tVar5 = tokenType::getTokenCategory((tokenType *)pIVar1);
      if (tVar5 == CHARTK) {
        cVar2 = Identifier::getCharValue(pIVar1,0);
        std::operator<<(local_1b0,cVar2);
        std::__cxx11::stringstream::str();
        std::operator+((char *)local_1f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"\'");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fn,
                       (char *)local_1f0);
        std::__cxx11::string::~string(local_1f0);
        std::__cxx11::string::~string(local_210);
      }
      else {
        iVar6 = Identifier::getIntValue(pIVar1,0);
        std::ostream::operator<<(local_1b0,iVar6);
        std::__cxx11::stringstream::str();
      }
    }
    goto LAB_0014c733;
  }
  std::__cxx11::string::string(local_570,(string *)varName1_local);
  boomVec((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_550,(string *)local_570);
  std::__cxx11::string::~string(local_570);
  sVar15 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_550);
  if (sVar15 == 1) {
    pvVar16 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_550,0);
    pcVar17 = (char *)std::__cxx11::string::at((ulong)pvVar16);
    iVar6 = isdigit((int)*pcVar17);
    if (iVar6 == 0) {
      pvVar16 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_550,0);
      std::__cxx11::string::string((string *)local_838,(string *)pvVar16);
      getRealName(local_858,(char)local_838);
      vVar7 = whatIsThisShit(local_858,(function *)varName_local);
      if (vVar7 == TEMP_VAR) {
        bVar3 = function::varHasReg((function *)varName_local,(string *)local_838);
        if (bVar3) {
          local_89c = function::getRegOfVar((function *)varName_local,(string *)local_838,true);
          std::
          map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::at(&reg2str_abi_cxx11_,&local_89c);
          std::operator+((char *)local_898,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "sll $t8 ");
          std::operator+(local_878,(char *)local_898);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,local_878);
          std::__cxx11::string::~string((string *)local_878);
          std::__cxx11::string::~string(local_898);
        }
        else {
          iVar6 = function::getOffsetOfTemp((function *)varName_local,(string *)local_838,true);
          std::__cxx11::to_string(local_900,iVar6);
          std::operator+((char *)local_8e0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "lw $t8 ");
          std::operator+(local_8c0,(char *)local_8e0);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,local_8c0);
          std::__cxx11::string::~string((string *)local_8c0);
          std::__cxx11::string::~string(local_8e0);
          std::__cxx11::string::~string((string *)local_900);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[14]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [14])"sll $t8 $t8 2");
        }
      }
      else {
        getValueOfVar(local_920,(function *)local_838);
        vVar7 = whatIsThisShit(local_920,(function *)varName_local);
        if (vVar7 == TEMP_VAR) {
          std::operator+((char *)local_960,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "sll $t8 ");
          std::operator+(local_940,(char *)local_960);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,local_940);
          std::__cxx11::string::~string((string *)local_940);
          std::__cxx11::string::~string(local_960);
        }
        else {
          iVar6 = std::__cxx11::stoi(local_920,(size_t *)0x0,10);
          std::__cxx11::to_string(local_9a0,iVar6 << 2);
          std::operator+((char *)local_980,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "li $t8 ");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,local_980);
          std::__cxx11::string::~string((string *)local_980);
          std::__cxx11::string::~string((string *)local_9a0);
        }
        std::__cxx11::string::~string((string *)local_920);
      }
      if (local_34 == 2) {
        local_9a4 = function::getOffSet((function *)varName_local,(string *)var_local);
        std::__cxx11::to_string(local_9e8,local_9a4);
        std::operator+((char *)local_9c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "li $t9 ");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,local_9c8);
        std::__cxx11::string::~string((string *)local_9c8);
        std::__cxx11::string::~string((string *)local_9e8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[16]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [16])"sub $t8 $t9 $t8");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[17]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t8 $sp");
      }
      else {
        std::__cxx11::stringstream::stringstream(local_b70);
        std::__cxx11::string::string(local_b90,(string *)var_local);
        local_b98._M_current = (char *)std::__cxx11::string::begin();
        local_ba0._M_current = (char *)std::__cxx11::string::end();
        local_ba8 = (char *)std::__cxx11::string::begin();
        _Stack_bb0 = std::
                     transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                               (local_b98,local_ba0,
                                (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_ba8,tolower);
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::at(&var2mem_abi_cxx11_,(key_type *)local_b90);
        local_bb4 = *pmVar12;
        poVar13 = std::operator<<(local_b60,"0x");
        poVar13 = (ostream *)std::ostream::operator<<(poVar13,std::hex);
        std::ostream::operator<<(poVar13,local_bb4);
        std::__cxx11::stringstream::str();
        std::operator+((char *)local_bd8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "li $t9 ");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,local_bd8);
        std::__cxx11::string::~string((string *)local_bd8);
        std::__cxx11::string::~string((string *)&d1_1);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[17]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t9 $t8");
        std::__cxx11::string::~string(local_b90);
        std::__cxx11::stringstream::~stringstream(local_b70);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[13]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,(char (*) [13])"lw $t9 ($t8)");
      d2 = 0x19;
      pmVar14 = std::
                map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::at(&reg2str_abi_cxx11_,(key_type *)&d2);
      std::__cxx11::string::string((string *)fn,(string *)pmVar14);
      std::__cxx11::string::~string((string *)local_858);
      std::__cxx11::string::~string((string *)local_838);
    }
    else {
      pvVar16 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_550,0);
      local_574 = std::__cxx11::stoi(pvVar16,(size_t *)0x0,10);
      std::__cxx11::to_string(local_5b8,local_574);
      std::operator+((char *)local_598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"li $t8 ")
      ;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,local_598);
      std::__cxx11::string::~string((string *)local_598);
      std::__cxx11::string::~string((string *)local_5b8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[14]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,(char (*) [14])"sll $t8 $t8 2");
      if (local_34 == 2) {
        local_5bc = function::getOffSet((function *)varName_local,(string *)var_local);
        std::__cxx11::to_string(local_600,local_5bc);
        std::operator+((char *)local_5e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "li $t9 ");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,local_5e0);
        std::__cxx11::string::~string((string *)local_5e0);
        std::__cxx11::string::~string((string *)local_600);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[16]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [16])"sub $t8 $t9 $t8");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[17]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t8 $sp");
      }
      else {
        std::__cxx11::stringstream::stringstream(local_788);
        std::__cxx11::string::string(local_7a8,(string *)var_local);
        local_7b0._M_current = (char *)std::__cxx11::string::begin();
        local_7b8._M_current = (char *)std::__cxx11::string::end();
        local_7c0 = (char *)std::__cxx11::string::begin();
        _Stack_7c8 = std::
                     transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                               (local_7b0,local_7b8,
                                (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_7c0,tolower);
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::at(&var2mem_abi_cxx11_,(key_type *)local_7a8);
        local_7cc = *pmVar12;
        poVar13 = std::operator<<(local_778,"0x");
        poVar13 = (ostream *)std::ostream::operator<<(poVar13,std::hex);
        std::ostream::operator<<(poVar13,local_7cc);
        std::__cxx11::stringstream::str();
        std::operator+((char *)local_7f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "li $t9 ");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,local_7f0);
        std::__cxx11::string::~string((string *)local_7f0);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffff7f0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[17]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t9 $t8");
        std::__cxx11::string::~string(local_7a8);
        std::__cxx11::stringstream::~stringstream(local_788);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[13]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,(char (*) [13])"lw $t9 ($t8)");
      local_814 = $t9;
      pmVar14 = std::
                map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::at(&reg2str_abi_cxx11_,&stack0xfffffffffffff7ec);
      std::__cxx11::string::string((string *)fn,(string *)pmVar14);
    }
  }
  else {
    pvVar16 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_550,0);
    pcVar17 = (char *)std::__cxx11::string::at((ulong)pvVar16);
    iVar6 = isdigit((int)*pcVar17);
    if (iVar6 != 0) {
      pvVar16 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_550,1);
      pcVar17 = (char *)std::__cxx11::string::at((ulong)pvVar16);
      iVar6 = isdigit((int)*pcVar17);
      if (iVar6 != 0) {
        pvVar16 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_550,0);
        index_1 = std::__cxx11::stoi(pvVar16,(size_t *)0x0,10);
        pvVar16 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_550,1);
        local_c04 = std::__cxx11::stoi(pvVar16,(size_t *)0x0,10);
        iVar6 = index_1;
        iVar8 = Identifier::getDimension(pIVar1,2);
        local_c08 = iVar6 * iVar8 + local_c04;
        std::__cxx11::to_string(local_c48,local_c08);
        std::operator+((char *)local_c28,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "li $t8 ");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,local_c28);
        std::__cxx11::string::~string((string *)local_c28);
        std::__cxx11::string::~string((string *)local_c48);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[14]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [14])"sll $t8 $t8 2");
        if (local_34 == 2) {
          local_c4c = function::getOffSet((function *)varName_local,(string *)var_local);
          std::__cxx11::to_string(local_c90,local_c4c);
          std::operator+((char *)local_c70,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "li $t9 ");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,local_c70);
          std::__cxx11::string::~string((string *)local_c70);
          std::__cxx11::string::~string((string *)local_c90);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[16]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [16])"sub $t8 $t9 $t8");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[17]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t8 $sp");
        }
        else {
          std::__cxx11::stringstream::stringstream(local_e18);
          std::__cxx11::string::string(local_e38,(string *)var_local);
          local_e40._M_current = (char *)std::__cxx11::string::begin();
          local_e48._M_current = (char *)std::__cxx11::string::end();
          local_e50 = (char *)std::__cxx11::string::begin();
          _Stack_e58 = std::
                       transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                                 (local_e40,local_e48,
                                  (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )local_e50,tolower);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::at(&var2mem_abi_cxx11_,(key_type *)local_e38);
          local_e5c = *pmVar12;
          poVar13 = std::operator<<(local_e08,"0x");
          poVar13 = (ostream *)std::ostream::operator<<(poVar13,std::hex);
          std::ostream::operator<<(poVar13,local_e5c);
          std::__cxx11::stringstream::str();
          std::operator+((char *)local_e80,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "li $t9 ");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,local_e80);
          std::__cxx11::string::~string((string *)local_e80);
          std::__cxx11::string::~string((string *)&d1_2);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[17]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t9 $t8");
          std::__cxx11::string::~string(local_e38);
          std::__cxx11::stringstream::~stringstream(local_e18);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[13]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [13])"lw $t9 ($t8)");
        local_ea4 = $t9;
        pmVar14 = std::
                  map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::at(&reg2str_abi_cxx11_,&stack0xfffffffffffff15c);
        std::__cxx11::string::string((string *)fn,(string *)pmVar14);
        goto LAB_0014c717;
      }
    }
    pvVar16 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_550,0);
    pcVar17 = (char *)std::__cxx11::string::at((ulong)pvVar16);
    iVar6 = isdigit((int)*pcVar17);
    if (iVar6 != 0) {
      pvVar16 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_550,1);
      pcVar17 = (char *)std::__cxx11::string::at((ulong)pvVar16);
      iVar6 = isdigit((int)*pcVar17);
      if (iVar6 == 0) {
        pvVar16 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_550,0);
        iVar6 = std::__cxx11::stoi(pvVar16,(size_t *)0x0,10);
        pvVar16 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_550,1);
        std::__cxx11::string::string((string *)local_ec8,(string *)pvVar16);
        getRealName(local_ee8,(char)local_ec8);
        vVar7 = whatIsThisShit(local_ee8,(function *)varName_local);
        if (vVar7 == TEMP_VAR) {
          bVar3 = function::varHasReg((function *)varName_local,(string *)local_ec8);
          if (bVar3) {
            local_f2c = function::getRegOfVar((function *)varName_local,(string *)local_ec8,true);
            std::
            map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at(&reg2str_abi_cxx11_,&local_f2c);
            std::operator+((char *)local_f28,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "sll $t8 ");
            std::operator+(local_f08,(char *)local_f28);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,local_f08);
            std::__cxx11::string::~string((string *)local_f08);
            std::__cxx11::string::~string(local_f28);
          }
          else {
            iVar8 = function::getOffsetOfTemp((function *)varName_local,(string *)local_ec8,true);
            std::__cxx11::to_string(local_f90,iVar8);
            std::operator+((char *)local_f70,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "lw $t8 ");
            std::operator+(local_f50,(char *)local_f70);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,local_f50);
            std::__cxx11::string::~string((string *)local_f50);
            std::__cxx11::string::~string(local_f70);
            std::__cxx11::string::~string((string *)local_f90);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[14]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,(char (*) [14])"sll $t8 $t8 2");
          }
        }
        else {
          getValueOfVar(local_fb0,(function *)local_ec8);
          vVar7 = whatIsThisShit(local_fb0,(function *)varName_local);
          if (vVar7 == TEMP_VAR) {
            std::operator+((char *)local_ff0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "sll $t8 ");
            std::operator+(local_fd0,(char *)local_ff0);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,local_fd0);
            std::__cxx11::string::~string((string *)local_fd0);
            std::__cxx11::string::~string(local_ff0);
          }
          else {
            iVar8 = std::__cxx11::stoi(local_fb0,(size_t *)0x0,10);
            std::__cxx11::to_string(local_1030,iVar8 << 2);
            std::operator+((char *)local_1010,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "li $t8 ");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,local_1010);
            std::__cxx11::string::~string((string *)local_1010);
            std::__cxx11::string::~string((string *)local_1030);
          }
          std::__cxx11::string::~string((string *)local_fb0);
        }
        if (local_34 == 2) {
          iVar8 = function::getOffSet((function *)varName_local,(string *)var_local);
          iVar9 = Identifier::getDimension(pIVar1,2);
          local_1034 = iVar8 + iVar6 * iVar9 * -4;
          std::__cxx11::to_string(local_1078,local_1034);
          std::operator+((char *)local_1058,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "li $t9 ");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,local_1058);
          std::__cxx11::string::~string((string *)local_1058);
          std::__cxx11::string::~string((string *)local_1078);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[16]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [16])"sub $t8 $t9 $t8");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[17]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t8 $sp");
        }
        else {
          std::__cxx11::stringstream::stringstream(local_1200);
          std::__cxx11::string::string(local_1220,(string *)var_local);
          local_1228._M_current = (char *)std::__cxx11::string::begin();
          local_1230._M_current = (char *)std::__cxx11::string::end();
          local_1238 = (char *)std::__cxx11::string::begin();
          _Stack_1240 = std::
                        transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                                  (local_1228,local_1230,
                                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )local_1238,tolower);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::at(&var2mem_abi_cxx11_,(key_type *)local_1220);
          iVar8 = *pmVar12;
          iVar9 = Identifier::getDimension(pIVar1,2);
          local_1244 = iVar8 + iVar6 * iVar9 * 4;
          poVar13 = std::operator<<(local_11f0,"0x");
          poVar13 = (ostream *)std::ostream::operator<<(poVar13,std::hex);
          std::ostream::operator<<(poVar13,local_1244);
          std::__cxx11::stringstream::str();
          std::operator+((char *)local_1268,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "li $t9 ");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,local_1268);
          std::__cxx11::string::~string((string *)local_1268);
          std::__cxx11::string::~string((string *)&d2_1);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[17]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t9 $t8");
          std::__cxx11::string::~string(local_1220);
          std::__cxx11::stringstream::~stringstream(local_1200);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[13]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [13])"lw $t9 ($t8)");
        local_128c = $t9;
        pmVar14 = std::
                  map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::at(&reg2str_abi_cxx11_,&stack0xffffffffffffed74);
        std::__cxx11::string::string((string *)fn,(string *)pmVar14);
        std::__cxx11::string::~string((string *)local_ee8);
        std::__cxx11::string::~string((string *)local_ec8);
        goto LAB_0014c717;
      }
    }
    pvVar16 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_550,0);
    pcVar17 = (char *)std::__cxx11::string::at((ulong)pvVar16);
    iVar6 = isdigit((int)*pcVar17);
    if (iVar6 == 0) {
      pvVar16 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_550,1);
      pcVar17 = (char *)std::__cxx11::string::at((ulong)pvVar16);
      iVar6 = isdigit((int)*pcVar17);
      if (iVar6 != 0) {
        pvVar16 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_550,1);
        iVar6 = std::__cxx11::stoi(pvVar16,(size_t *)0x0,10);
        pvVar16 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_550,0);
        std::__cxx11::string::string((string *)local_12b0,(string *)pvVar16);
        getRealName(local_12d0,(char)local_12b0);
        vVar7 = whatIsThisShit(local_12d0,(function *)varName_local);
        if (vVar7 == TEMP_VAR) {
          bVar3 = function::varHasReg((function *)varName_local,(string *)local_12b0);
          if (bVar3) {
            local_1334 = function::getRegOfVar((function *)varName_local,(string *)local_12b0,true);
            std::
            map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at(&reg2str_abi_cxx11_,&local_1334);
            std::operator+((char *)local_1330,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "mul $t8 ");
            std::operator+(local_1310,(char *)local_1330);
            iVar8 = Identifier::getDimension(pIVar1,2);
            std::__cxx11::to_string(local_1358,iVar8 << 2);
            std::operator+(local_12f0,local_1310);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,local_12f0);
            std::__cxx11::string::~string((string *)local_12f0);
            std::__cxx11::string::~string((string *)local_1358);
            std::__cxx11::string::~string((string *)local_1310);
            std::__cxx11::string::~string(local_1330);
          }
          else {
            iVar8 = function::getOffsetOfTemp((function *)varName_local,(string *)local_12b0,true);
            std::__cxx11::to_string(local_13b8,iVar8);
            std::operator+((char *)local_1398,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "lw $t8 ");
            std::operator+(local_1378,(char *)local_1398);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,local_1378);
            std::__cxx11::string::~string((string *)local_1378);
            std::__cxx11::string::~string(local_1398);
            std::__cxx11::string::~string((string *)local_13b8);
            iVar8 = Identifier::getDimension(pIVar1,2);
            std::__cxx11::to_string(local_13f8,iVar8 << 2);
            std::operator+((char *)local_13d8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "mul $t8 $t8 ");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,local_13d8);
            std::__cxx11::string::~string((string *)local_13d8);
            std::__cxx11::string::~string((string *)local_13f8);
          }
        }
        else {
          getValueOfVar(local_1418,(function *)local_12b0);
          vVar7 = whatIsThisShit(local_1418,(function *)varName_local);
          if (vVar7 == TEMP_VAR) {
            std::operator+((char *)local_1478,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "mul $t8 ");
            std::operator+(local_1458,(char *)local_1478);
            iVar8 = Identifier::getDimension(pIVar1,2);
            std::__cxx11::to_string(local_1498,iVar8 << 2);
            std::operator+(local_1438,local_1458);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,local_1438);
            std::__cxx11::string::~string((string *)local_1438);
            std::__cxx11::string::~string((string *)local_1498);
            std::__cxx11::string::~string((string *)local_1458);
            std::__cxx11::string::~string(local_1478);
          }
          else {
            iVar8 = std::__cxx11::stoi(local_1418,(size_t *)0x0,10);
            iVar9 = Identifier::getDimension(pIVar1,2);
            std::__cxx11::to_string(local_14d8,iVar8 * iVar9 * 4);
            std::operator+((char *)local_14b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "li $t8 ");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,local_14b8);
            std::__cxx11::string::~string((string *)local_14b8);
            std::__cxx11::string::~string((string *)local_14d8);
          }
          std::__cxx11::string::~string((string *)local_1418);
        }
        std::__cxx11::to_string(local_1518,iVar6 << 2);
        std::operator+((char *)local_14f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "addi $t8 $t8 ");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,local_14f8);
        std::__cxx11::string::~string((string *)local_14f8);
        std::__cxx11::string::~string((string *)local_1518);
        if (local_34 == 2) {
          local_151c = function::getOffSet((function *)varName_local,(string *)var_local);
          std::__cxx11::to_string(local_1560,local_151c);
          std::operator+((char *)local_1540,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "li $t9 ");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,local_1540);
          std::__cxx11::string::~string((string *)local_1540);
          std::__cxx11::string::~string((string *)local_1560);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[16]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [16])"sub $t8 $t9 $t8");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[17]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t8 $sp");
        }
        else {
          std::__cxx11::stringstream::stringstream(local_16e8);
          std::__cxx11::string::string(local_1708,(string *)var_local);
          local_1710._M_current = (char *)std::__cxx11::string::begin();
          local_1718._M_current = (char *)std::__cxx11::string::end();
          local_1720 = (_Base_ptr)std::__cxx11::string::begin();
          _Stack_1728 = std::
                        transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                                  (local_1710,local_1718,
                                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )local_1720,tolower);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::at(&var2mem_abi_cxx11_,(key_type *)local_1708);
          local_172c = *pmVar12;
          poVar13 = std::operator<<(local_16d8,"0x");
          poVar13 = (ostream *)std::ostream::operator<<(poVar13,std::hex);
          std::ostream::operator<<(poVar13,local_172c);
          std::__cxx11::stringstream::str();
          std::operator+((char *)local_1750,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "li $t9 ");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,local_1750);
          std::__cxx11::string::~string((string *)local_1750);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffe890);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[17]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t9 $t8");
          std::__cxx11::string::~string(local_1708);
          std::__cxx11::stringstream::~stringstream(local_16e8);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[13]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [13])"lw $t9 ($t8)");
        local_1774 = $t9;
        pmVar14 = std::
                  map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::at(&reg2str_abi_cxx11_,&stack0xffffffffffffe88c);
        std::__cxx11::string::string((string *)fn,(string *)pmVar14);
        std::__cxx11::string::~string((string *)local_12d0);
        std::__cxx11::string::~string((string *)local_12b0);
        goto LAB_0014c717;
      }
    }
    pvVar16 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_550,0);
    std::__cxx11::string::string((string *)local_1798,(string *)pvVar16);
    pvVar16 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_550,1);
    std::__cxx11::string::string((string *)local_17b8,(string *)pvVar16);
    getRealName(local_17d8,(char)local_1798);
    getRealName((string *)&ty2,(char)local_17b8);
    local_17fc = whatIsThisShit(local_17d8,(function *)varName_local);
    local_1800 = whatIsThisShit((string *)&ty2,(function *)varName_local);
    if (local_17fc == TEMP_VAR) {
      bVar3 = function::varHasReg((function *)varName_local,(string *)local_1798);
      if (bVar3) {
        local_1864 = function::getRegOfVar((function *)varName_local,(string *)local_1798,true);
        std::
        map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::at(&reg2str_abi_cxx11_,&local_1864);
        std::operator+((char *)local_1860,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "mul $t8 ");
        std::operator+(local_1840,(char *)local_1860);
        iVar6 = Identifier::getDimension(pIVar1,2);
        std::__cxx11::to_string(local_1888,iVar6);
        std::operator+(local_1820,local_1840);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,local_1820);
        std::__cxx11::string::~string((string *)local_1820);
        std::__cxx11::string::~string((string *)local_1888);
        std::__cxx11::string::~string((string *)local_1840);
        std::__cxx11::string::~string(local_1860);
      }
      else {
        iVar6 = function::getOffsetOfTemp((function *)varName_local,(string *)local_1798,true);
        std::__cxx11::to_string(local_18e8,iVar6);
        std::operator+((char *)local_18c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "lw $t8 ");
        std::operator+(local_18a8,(char *)local_18c8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,local_18a8);
        std::__cxx11::string::~string((string *)local_18a8);
        std::__cxx11::string::~string(local_18c8);
        std::__cxx11::string::~string((string *)local_18e8);
        iVar6 = Identifier::getDimension(pIVar1,2);
        std::__cxx11::to_string(local_1928,iVar6);
        std::operator+((char *)local_1908,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "mul $t8 $t8 ");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,local_1908);
        std::__cxx11::string::~string((string *)local_1908);
        std::__cxx11::string::~string((string *)local_1928);
      }
    }
    else {
      getValueOfVar(local_1948,(function *)local_1798);
      vVar7 = whatIsThisShit(local_1948,(function *)varName_local);
      if (vVar7 == TEMP_VAR) {
        std::operator+((char *)local_19a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "mul $t8 ");
        std::operator+(local_1988,(char *)local_19a8);
        iVar6 = Identifier::getDimension(pIVar1,2);
        std::__cxx11::to_string(local_19c8,iVar6);
        std::operator+(local_1968,local_1988);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,local_1968);
        std::__cxx11::string::~string((string *)local_1968);
        std::__cxx11::string::~string((string *)local_19c8);
        std::__cxx11::string::~string((string *)local_1988);
        std::__cxx11::string::~string(local_19a8);
      }
      else {
        iVar6 = std::__cxx11::stoi(local_1948,(size_t *)0x0,10);
        iVar8 = Identifier::getDimension(pIVar1,2);
        std::__cxx11::to_string(local_1a08,iVar6 * iVar8);
        std::operator+((char *)local_19e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "li $t8 ");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,local_19e8);
        std::__cxx11::string::~string((string *)local_19e8);
        std::__cxx11::string::~string((string *)local_1a08);
      }
      std::__cxx11::string::~string((string *)local_1948);
    }
    if (local_1800 == TEMP_VAR) {
      bVar3 = function::varHasReg((function *)varName_local,(string *)local_17b8);
      if (bVar3) {
        local_1a2c = function::getRegOfVar((function *)varName_local,(string *)local_17b8,true);
        std::
        map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::at(&reg2str_abi_cxx11_,&local_1a2c);
        std::operator+((char *)local_1a28,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "addu $t8 $t8 ");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,local_1a28);
        std::__cxx11::string::~string((string *)local_1a28);
      }
      else {
        iVar6 = function::getOffsetOfTemp((function *)varName_local,(string *)local_17b8,true);
        std::__cxx11::to_string(local_1a90,iVar6);
        std::operator+((char *)local_1a70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "lw $t9 ");
        std::operator+(local_1a50,(char *)local_1a70);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,local_1a50);
        std::__cxx11::string::~string((string *)local_1a50);
        std::__cxx11::string::~string(local_1a70);
        std::__cxx11::string::~string((string *)local_1a90);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[17]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t8 $t9");
      }
    }
    else {
      std::__cxx11::string::string(local_1ab0);
      if ((v1 & 1U) == 0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[13]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [13])"la $v1 ($t8)");
        std::__cxx11::string::operator=(local_1ab0,"v1");
        v1 = true;
      }
      else {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[13]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [13])"la $s7 ($t8)");
        std::__cxx11::string::operator=(local_1ab0,"s7");
        s7 = true;
      }
      getValueOfVar(local_1ad0,(function *)local_17b8);
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1ab0,"v1");
      if (bVar3) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[13]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [13])"la $t8 ($v1)");
        v1 = false;
      }
      else {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[13]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [13])"la $t8 ($s7)");
        s7 = false;
      }
      vVar7 = whatIsThisShit(local_1ad0,(function *)varName_local);
      if (vVar7 == TEMP_VAR) {
        std::operator+((char *)local_1af0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "addu $t8 $t8 ");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,local_1af0);
        std::__cxx11::string::~string((string *)local_1af0);
      }
      else {
        iVar6 = std::__cxx11::stoi(local_1ad0,(size_t *)0x0,10);
        std::__cxx11::to_string(local_1b30,iVar6);
        std::operator+((char *)local_1b10,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "addi $t8 $t8 ");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,local_1b10);
        std::__cxx11::string::~string((string *)local_1b10);
        std::__cxx11::string::~string((string *)local_1b30);
      }
      std::__cxx11::string::~string((string *)local_1ad0);
      std::__cxx11::string::~string(local_1ab0);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[14]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,(char (*) [14])"sll $t8 $t8 2");
    if (local_34 == 2) {
      local_1b34 = function::getOffSet((function *)varName_local,(string *)var_local);
      std::__cxx11::to_string(local_1b78,local_1b34);
      std::operator+((char *)local_1b58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"li $t9 ")
      ;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,local_1b58);
      std::__cxx11::string::~string((string *)local_1b58);
      std::__cxx11::string::~string((string *)local_1b78);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[16]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,(char (*) [16])"sub $t8 $t9 $t8");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[17]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t8 $sp");
    }
    else {
      std::__cxx11::stringstream::stringstream(local_1d00);
      std::__cxx11::string::string(local_1d20,(string *)var_local);
      local_1d28._M_current = (char *)std::__cxx11::string::begin();
      local_1d30._M_current = (char *)std::__cxx11::string::end();
      local_1d38 = (char *)std::__cxx11::string::begin();
      _Stack_1d40 = std::
                    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                              (local_1d28,local_1d30,
                               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )local_1d38,tolower);
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::at(&var2mem_abi_cxx11_,(key_type *)local_1d20);
      local_1d44 = *pmVar12;
      poVar13 = std::operator<<(local_1cf0,"0x");
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,std::hex);
      std::ostream::operator<<(poVar13,local_1d44);
      std::__cxx11::stringstream::str();
      std::operator+((char *)local_1d68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"li $t9 ")
      ;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,local_1d68);
      std::__cxx11::string::~string((string *)local_1d68);
      std::__cxx11::string::~string(local_1d88);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[17]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t9 $t8");
      std::__cxx11::string::~string(local_1d20);
      std::__cxx11::stringstream::~stringstream(local_1d00);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[13]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,(char (*) [13])"lw $t9 ($t8)");
    local_1d8c = $t9;
    pmVar14 = std::
              map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at(&reg2str_abi_cxx11_,&local_1d8c);
    std::__cxx11::string::string((string *)fn,(string *)pmVar14);
    std::__cxx11::string::~string((string *)&ty2);
    std::__cxx11::string::~string((string *)local_17d8);
    std::__cxx11::string::~string((string *)local_17b8);
    std::__cxx11::string::~string((string *)local_1798);
  }
LAB_0014c717:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_550);
LAB_0014c733:
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return fn;
}

Assistant:

string getValueOfVarIml(function &fn, string &varName, string &varName1, Identifier var, enum varType type) {
    stringstream stream;
    if (varName.find('[') == string::npos) {//普通标识符
        if (var.initialized && var.getIdCategory() == CONST) {//是否是初始化变量
            if (var.getTokenCategory() == CHARTK) {
                stream << var.getCharValue(0);
                return "\'" + stream.str() + "\'";
            } else {
                stream << var.getIntValue(0);
                return stream.str();
            }
        } else {
            string name = varName1;
            transform(name.begin(), name.end(), name.begin(), ::tolower);
            if (fn.varHasReg(varName1)) {//寄存器中存在
                return reg2str.at(fn.getRegOfVar(varName1, true));
            } else if (fn.stackHasVar(varName1) || var2mem.count(name) != 0) {//堆或栈中存在
                int offset;
                if (fn.stackHasVar(varName1)) {
                    offset = fn.getOffSet(varName1);
                    mipsCode.emplace_back("lw $t9 " + to_string(offset) + "($sp)");
                } else {
                    stringstream stream2;
                    string name0 = varName;
                    transform(name0.begin(), name0.end(), name0.begin(), ::tolower);
                    offset = var2mem.at(name0);
                    stream2 << "0x" << hex << offset;
                    mipsCode.emplace_back("lw $t9 " + stream2.str());
                }
                return reg2str.at($t9);
            } else {//分配
                variableArrangeSpace(fn, varName1, whatIsThisShit(varName1, fn));
                if (fn.varHasReg(varName1))
                    return reg2str.at(fn.getRegOfVar(varName1, false));
                else {
                    mipsCode.emplace_back("lw $t9 " + to_string(fn.getOffSet(varName1)) + "($sp)");
                    return reg2str.at($t9);
                }
            }
        }
    } else {
        vector<string> elements = boomVec(varName);
        if (elements.size() == 1) {//一维数组
            if (isdigit(elements.at(0).at(0))) {//数字下标
                int d1 = stoi(elements.at(0));
                mipsCode.emplace_back("li $t8 " + to_string(d1));
                mipsCode.emplace_back("sll $t8 $t8 2");
                if (type == LOCAL_VAR) {//局部数组变量存于栈中
                    int base = fn.getOffSet(varName1);
                    mipsCode.emplace_back("li $t9 " + to_string(base));
                    mipsCode.emplace_back("sub $t8 $t9 $t8");
                    mipsCode.emplace_back("addu $t8 $t8 $sp");
                } else {//全局数组变量存于堆中
                    stringstream stream2;
                    string name0 = varName1;
                    transform(name0.begin(), name0.end(), name0.begin(), ::tolower);
                    int base = var2mem.at(name0);
                    stream2 << "0x" << hex << base;
                    mipsCode.emplace_back("li $t9 " + stream2.str());
                    mipsCode.emplace_back("addu $t8 $t9 $t8");
                }
                mipsCode.emplace_back("lw $t9 ($t8)");
                return reg2str.at($t9);
            } else {//变量下标
                string index = elements.at(0);
                string realName = getRealName(index, '[');
                if (whatIsThisShit(realName, fn) == TEMP_VAR) {
                    if (fn.varHasReg(index))
                        mipsCode.emplace_back("sll $t8 " +
                                              reg2str.at(fn.getRegOfVar(index, true)) + " 2");
                    else {
                        mipsCode.emplace_back("lw $t8 " + to_string(fn.getOffsetOfTemp(index, true)) + "($sp)");
                        mipsCode.emplace_back("sll $t8 $t8 2");
                    }
                } else {
                    string vn = getValueOfVar(index, fn);
                    if (whatIsThisShit(vn, fn) == TEMP_VAR)//$t9
                        mipsCode.emplace_back("sll $t8 " + vn + " 2");
                    else//变量转数字
                        mipsCode.emplace_back("li $t8 " + to_string(stoi(vn) * 4));
                }
                if (type == LOCAL_VAR) {//局部数组变量存于栈中
                    int base = fn.getOffSet(varName1);
                    mipsCode.emplace_back("li $t9 " + to_string(base));
                    mipsCode.emplace_back("sub $t8 $t9 $t8");
                    mipsCode.emplace_back("addu $t8 $t8 $sp");
                } else {//全局数组变量存于堆中
                    stringstream stream2;
                    string name0 = varName1;
                    transform(name0.begin(), name0.end(), name0.begin(), ::tolower);
                    int base = var2mem.at(name0);
                    stream2 << "0x" << hex << base;
                    mipsCode.emplace_back("li $t9 " + stream2.str());
                    mipsCode.emplace_back("addu $t8 $t9 $t8");
                }
                mipsCode.emplace_back("lw $t9 ($t8)");
                return reg2str.at($t9);
            }
        } else {//二维数组
            if (isdigit(elements.at(0).at(0))
                && isdigit(elements.at(1).at(0))) {//两个都是数字下标
                int d1 = stoi(elements.at(0));
                int d2 = stoi(elements.at(1));
                int index = d1 * var.getDimension(2) + d2;
                mipsCode.emplace_back("li $t8 " + to_string(index));
                mipsCode.emplace_back("sll $t8 $t8 2");
                if (type == LOCAL_VAR) {//局部数组变量存于栈中
                    int base = fn.getOffSet(varName1);
                    mipsCode.emplace_back("li $t9 " + to_string(base));
                    mipsCode.emplace_back("sub $t8 $t9 $t8");
                    mipsCode.emplace_back("addu $t8 $t8 $sp");
                } else {//全局数组变量存于堆中
                    stringstream stream2;
                    string name0 = varName1;
                    transform(name0.begin(), name0.end(), name0.begin(), ::tolower);
                    int base = var2mem.at(name0);
                    stream2 << "0x" << hex << base;
                    mipsCode.emplace_back("li $t9 " + stream2.str());
                    mipsCode.emplace_back("addu $t8 $t9 $t8");
                }
                mipsCode.emplace_back("lw $t9 ($t8)");
                return reg2str.at($t9);
            } else if (isdigit(elements.at(0).at(0))
                       && !isdigit(elements.at(1).at(0))) {//第一维是数字下标，第二维不是
                int d1 = stoi(elements.at(0));
                string index = elements.at(1);
                string realName = getRealName(index, '[');
                if (whatIsThisShit(realName, fn) == TEMP_VAR) {
                    if (fn.varHasReg(index))
                        mipsCode.emplace_back("sll $t8 " +
                                              reg2str.at(fn.getRegOfVar(index, true)) + " 2");
                    else {
                        mipsCode.emplace_back("lw $t8 " + to_string(fn.getOffsetOfTemp(index, true)) + "($sp)");
                        mipsCode.emplace_back("sll $t8 $t8 2");
                    }
                } else {
                    string vn = getValueOfVar(index, fn);
                    if (whatIsThisShit(vn, fn) == TEMP_VAR)//$t9
                        mipsCode.emplace_back("sll $t8 " + vn + " 2");
                    else
                        mipsCode.emplace_back("li $t8 " + to_string(stoi(vn) * 4));
                }
                if (type == LOCAL_VAR) {//局部数组变量存于栈中
                    int base = fn.getOffSet(varName1) - d1 * var.getDimension(2) * 4;
                    mipsCode.emplace_back("li $t9 " + to_string(base));
                    mipsCode.emplace_back("sub $t8 $t9 $t8");
                    mipsCode.emplace_back("addu $t8 $t8 $sp");
                } else {//全局数组变量存于堆中
                    stringstream stream2;
                    string name0 = varName1;
                    transform(name0.begin(), name0.end(), name0.begin(), ::tolower);
                    int base = var2mem.at(name0) + d1 * var.getDimension(2) * 4;
                    stream2 << "0x" << hex << base;
                    mipsCode.emplace_back("li $t9 " + stream2.str());
                    mipsCode.emplace_back("addu $t8 $t9 $t8");
                }
                mipsCode.emplace_back("lw $t9 ($t8)");
                return reg2str.at($t9);
            } else if (!isdigit(elements.at(0).at(0))
                       && isdigit(elements.at(1).at(0))) {//第一维不是数字下标，第二维是
                int d2 = stoi(elements.at(1)) * 4;
                string index = elements.at(0);
                string realName = getRealName(index, '[');
                if (whatIsThisShit(realName, fn) == TEMP_VAR) {
                    if (fn.varHasReg(index))
                        mipsCode.emplace_back("mul $t8 " +
                                              reg2str.at(fn.getRegOfVar(index, true)) + " " +
                                              to_string(var.getDimension(2) * 4));
                    else {
                        mipsCode.emplace_back("lw $t8 " + to_string(fn.getOffsetOfTemp(index, true)) + "($sp)");
                        mipsCode.emplace_back("mul $t8 $t8 " + to_string(var.getDimension(2) * 4));
                    }
                } else {
                    string vn = getValueOfVar(index, fn);
                    if (whatIsThisShit(vn, fn) == TEMP_VAR)//$t9
                        mipsCode.emplace_back("mul $t8 " + vn + " " +
                                              to_string(var.getDimension(2) * 4));
                    else
                        mipsCode.emplace_back(
                                "li $t8 " + to_string(stoi(vn) * var.getDimension(2) * 4));
                }
                mipsCode.emplace_back("addi $t8 $t8 " + to_string(d2));
                if (type == LOCAL_VAR) {//局部数组变量存于栈中
                    int base = fn.getOffSet(varName1);
                    mipsCode.emplace_back("li $t9 " + to_string(base));
                    mipsCode.emplace_back("sub $t8 $t9 $t8");
                    mipsCode.emplace_back("addu $t8 $t8 $sp");
                } else {//全局数组变量存于堆中
                    stringstream stream2;
                    string name0 = varName1;
                    transform(name0.begin(), name0.end(), name0.begin(), ::tolower);
                    int base = var2mem.at(name0);
                    stream2 << "0x" << hex << base;
                    mipsCode.emplace_back("li $t9 " + stream2.str());
                    mipsCode.emplace_back("addu $t8 $t9 $t8");
                }
                mipsCode.emplace_back("lw $t9 ($t8)");
                return reg2str.at($t9);
            } else {//第一维和第二维都不是数字下标
                string index1 = elements.at(0);
                string index2 = elements.at(1);
                string realName1 = getRealName(index1, '[');
                string realName2 = getRealName(index2, '[');
                varType ty1 = whatIsThisShit(realName1, fn);
                varType ty2 = whatIsThisShit(realName2, fn);
                if (ty1 == TEMP_VAR) {
                    if (fn.varHasReg(index1))
                        mipsCode.emplace_back("mul $t8 " +
                                              reg2str.at(fn.getRegOfVar(index1, true)) + " " +
                                              to_string(var.getDimension(2)));
                    else {
                        mipsCode.emplace_back("lw $t8 " + to_string(fn.getOffsetOfTemp(index1, true)) + "($sp)");
                        mipsCode.emplace_back("mul $t8 $t8 " + to_string(var.getDimension(2)));
                    }
                } else {
                    string vn = getValueOfVar(index1, fn);
                    if (whatIsThisShit(vn, fn) == TEMP_VAR)//$t9
                        mipsCode.emplace_back("mul $t8 " + vn + " " +
                                              to_string(var.getDimension(2)));
                    else
                        mipsCode.emplace_back(
                                "li $t8 " + to_string(stoi(vn) * var.getDimension(2)));
                }
                if (ty2 == TEMP_VAR) {
                    if (fn.varHasReg(index2))
                        mipsCode.emplace_back("addu $t8 $t8 " + reg2str.at(fn.getRegOfVar(index2, true)));
                    else {
                        mipsCode.emplace_back("lw $t9 " + to_string(fn.getOffsetOfTemp(index2, true)) + "($sp)");
                        mipsCode.emplace_back("addu $t8 $t8 $t9");
                    }
                } else {
                    string choose;
                    if (!v1) {
                        mipsCode.emplace_back("la $v1 ($t8)");
                        choose = "v1";
                        v1 = true;
                    } else {
                        mipsCode.emplace_back("la $s7 ($t8)");
                        choose = "s7";
                        s7 = true;
                    }
                    string vn = getValueOfVar(index2, fn);
                    if (choose == "v1") {
                        mipsCode.emplace_back("la $t8 ($v1)");
                        v1 = false;
                    } else {
                        mipsCode.emplace_back("la $t8 ($s7)");
                        s7 = false;
                    }
                    if (whatIsThisShit(vn, fn) == TEMP_VAR)//$t9
                        mipsCode.emplace_back("addu $t8 $t8 " + vn);
                    else
                        mipsCode.emplace_back("addi $t8 $t8 " + to_string(stoi(vn)));
                }
                mipsCode.emplace_back("sll $t8 $t8 2");
                if (type == LOCAL_VAR) {//局部数组变量存于栈中
                    int base = fn.getOffSet(varName1);
                    mipsCode.emplace_back("li $t9 " + to_string(base));
                    mipsCode.emplace_back("sub $t8 $t9 $t8");
                    mipsCode.emplace_back("addu $t8 $t8 $sp");
                } else {//全局数组变量存于堆中
                    stringstream stream2;
                    string name0 = varName1;
                    transform(name0.begin(), name0.end(), name0.begin(), ::tolower);
                    int base = var2mem.at(name0);
                    stream2 << "0x" << hex << base;
                    mipsCode.emplace_back("li $t9 " + stream2.str());
                    mipsCode.emplace_back("addu $t8 $t9 $t8");
                }
                mipsCode.emplace_back("lw $t9 ($t8)");
                return reg2str.at($t9);
            }
        }
    }
}